

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O2

int Abc_NtkCountAndNodes(Vec_Ptr_t *vOrder)

{
  long lVar1;
  void *pvVar2;
  uint uVar3;
  int i;
  int iVar4;
  
  i = 0;
  iVar4 = 0;
  do {
    if (vOrder->nSize <= i) {
      return iVar4;
    }
    pvVar2 = Vec_PtrEntry(vOrder,i);
    uVar3 = *(uint *)((long)pvVar2 + 0x14) & 0xf;
    if (uVar3 == 7) {
      iVar4 = iVar4 + 1;
    }
    else {
      if (uVar3 != 10 && (*(uint *)((long)pvVar2 + 0x14) & 0xe) != 8) {
        __assert_fail("Abc_ObjIsBox(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                      ,0x139,"int Abc_NtkCountAndNodes(Vec_Ptr_t *)");
      }
      lVar1 = *(long *)(*(long *)((long)pvVar2 + 0x38) + 0x158);
      iVar4 = iVar4 + *(int *)(lVar1 + 0x18) +
              ~(*(int *)(*(long *)(lVar1 + 0x48) + 4) + *(int *)(*(long *)(lVar1 + 0x40) + 4));
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Abc_NtkCountAndNodes( Vec_Ptr_t * vOrder )
{
    Gia_Man_t * pGiaBox;
    Abc_Ntk_t * pNtkModel;
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
    {
        if ( Abc_ObjIsNode(pObj) )
        {
            Counter++;
            continue;
        }
        assert( Abc_ObjIsBox(pObj) );
        pNtkModel = (Abc_Ntk_t *)pObj->pData;
        pGiaBox   = (Gia_Man_t *)pNtkModel->pData;
        Counter  += Gia_ManAndNum(pGiaBox);
    }
    return Counter;
}